

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int bgzf_is_bgzf(char *fn)

{
  int iVar1;
  hFILE *fp;
  size_t __n;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  uint8_t buf [16];
  char local_38;
  char cStack_37;
  char cStack_36;
  char cStack_35;
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char cStack_30;
  char cStack_2f;
  char cStack_2e;
  char cStack_2d;
  char cStack_2c;
  char cStack_2b;
  char cStack_2a;
  char cStack_29;
  
  fp = hopen(fn,"r");
  uVar2 = 0;
  if (fp != (hFILE *)0x0) {
    uVar3 = (long)fp->end - (long)fp->begin;
    __n = 0x10;
    if (uVar3 < 0x10) {
      __n = uVar3;
    }
    memcpy(&local_38,fp->begin,__n);
    fp->begin = fp->begin + __n;
    if (uVar3 < 0x10) {
      __n = hread2(fp,&local_38,0x10,__n);
    }
    iVar1 = hclose(fp);
    if (iVar1 < 0) {
      uVar2 = 0xffffffff;
    }
    else if ((int)__n == 0x10) {
      auVar4[0] = -(local_38 == '\x1f');
      auVar4[1] = -(cStack_37 == -0x75);
      auVar4[2] = -(cStack_36 == '\b');
      auVar4[3] = -(cStack_35 == '\x04');
      auVar4[4] = -(cStack_34 == '\0');
      auVar4[5] = -(cStack_33 == '\0');
      auVar4[6] = -(cStack_32 == '\0');
      auVar4[7] = -(cStack_31 == '\0');
      auVar4[8] = -(cStack_30 == '\0');
      auVar4[9] = -(cStack_2f == -1);
      auVar4[10] = -(cStack_2e == '\x06');
      auVar4[0xb] = -(cStack_2d == '\0');
      auVar4[0xc] = -(cStack_2c == 'B');
      auVar4[0xd] = -(cStack_2b == 'C');
      auVar4[0xe] = -(cStack_2a == '\x02');
      auVar4[0xf] = -(cStack_29 == '\0');
      uVar2 = (uint)((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                             (ushort)(auVar4[0xf] >> 7) << 0xf) == 0xffff);
    }
  }
  return uVar2;
}

Assistant:

int bgzf_is_bgzf(const char *fn)
{
    uint8_t buf[16];
    int n;
    hFILE *fp;
    if ((fp = hopen(fn, "r")) == 0) return 0;
    n = hread(fp, buf, 16);
    if ( hclose(fp) < 0 ) return -1;
    if (n != 16) return 0;
    return memcmp(g_magic, buf, 16) == 0? 1 : 0;
}